

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_object_features
          (Impl *this,Value *state,VkPhysicalDeviceShaderObjectFeaturesEXT **out_features)

{
  VkPhysicalDeviceShaderObjectFeaturesEXT *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPhysicalDeviceShaderObjectFeaturesEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x18,0x10);
  if (pVVar1 != (VkPhysicalDeviceShaderObjectFeaturesEXT *)0x0) {
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    *(undefined8 *)&pVVar1->shaderObject = 0;
  }
  *out_features = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"shaderObject");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->shaderObject = (pGVar2->data_).s.length;
    return true;
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_shader_object_features(
		const Value &state,
		VkPhysicalDeviceShaderObjectFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceShaderObjectFeaturesEXT>();
	*out_features = features;

	features->shaderObject = state["shaderObject"].GetUint();
	return true;
}